

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.cpp
# Opt level: O0

int __thiscall IdentifierExp::eval(IdentifierExp *this,EvalState *state)

{
  EvalState *this_00;
  bool bVar1;
  int iVar2;
  string local_90 [39];
  allocator local_69;
  string local_68 [48];
  string local_38 [32];
  EvalState *local_18;
  EvalState *state_local;
  IdentifierExp *this_local;
  
  local_18 = state;
  state_local = (EvalState *)this;
  std::__cxx11::string::string(local_38,(string *)&this->name);
  bVar1 = EvalState::isDefined(state,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"VARIABLE NOT DEFINED",&local_69);
    error((string *)local_68);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  this_00 = local_18;
  std::__cxx11::string::string(local_90,(string *)&this->name);
  iVar2 = EvalState::getValue(this_00,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  return iVar2;
}

Assistant:

int IdentifierExp::eval(EvalState & state) {
   if (!state.isDefined(name)) error("VARIABLE NOT DEFINED");
   return state.getValue(name);
}